

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result wabt::ApplyNames(Module *module)

{
  Result RVar1;
  undefined1 local_c8 [8];
  NameApplier applier;
  Module *module_local;
  
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)module;
  anon_unknown_12::NameApplier::NameApplier((NameApplier *)local_c8);
  RVar1 = anon_unknown_12::NameApplier::VisitModule
                    ((NameApplier *)local_c8,
                     (Module *)
                     applier.labels_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  anon_unknown_12::NameApplier::~NameApplier((NameApplier *)local_c8);
  return (Result)RVar1.enum_;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}